

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::IsActiveScriptPubKeyMan(CWallet *this,ScriptPubKeyMan *spkm)

{
  long lVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (p_Var2 = (this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ; (_Rb_tree_header *)p_Var2 !=
        &(this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    if ((ScriptPubKeyMan *)p_Var2[1]._M_parent == spkm) {
      bVar4 = true;
      goto LAB_005379fa;
    }
  }
  p_Var2 = (this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    bVar4 = false;
  }
  else {
    do {
      bVar4 = (ScriptPubKeyMan *)p_Var2[1]._M_parent == spkm;
      if (bVar4) break;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
LAB_005379fa:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CWallet::IsActiveScriptPubKeyMan(const ScriptPubKeyMan& spkm) const
{
    for (const auto& [_, ext_spkm] : m_external_spk_managers) {
        if (ext_spkm == &spkm) return true;
    }
    for (const auto& [_, int_spkm] : m_internal_spk_managers) {
        if (int_spkm == &spkm) return true;
    }
    return false;
}